

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
GeneratorProfile_defaultMiscellaneousValues_Test::GeneratorProfile_defaultMiscellaneousValues_Test
          (GeneratorProfile_defaultMiscellaneousValues_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00175558;
  return;
}

Assistant:

TEST(GeneratorProfile, defaultMiscellaneousValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ("/* [CODE] */\n", generatorProfile->commentString());
    EXPECT_EQ("The content of this file was generated using [PROFILE_INFORMATION] libCellML [LIBCELLML_VERSION].", generatorProfile->originCommentString());

    EXPECT_EQ("model.h", generatorProfile->interfaceFileNameString());

    EXPECT_EQ("#pragma once\n"
              "\n"
              "#include <stddef.h>\n",
              generatorProfile->interfaceHeaderString());
    EXPECT_EQ("#include \"[INTERFACE_FILE_NAME]\"\n"
              "\n"
              "#include <math.h>\n"
              "#include <stdlib.h>\n",
              generatorProfile->implementationHeaderString());

    EXPECT_EQ("extern const char VERSION[];\n", generatorProfile->interfaceVersionString());
    EXPECT_EQ("const char VERSION[] = \"0.5.0\";\n", generatorProfile->implementationVersionString());

    EXPECT_EQ("extern const char LIBCELLML_VERSION[];\n", generatorProfile->interfaceLibcellmlVersionString());
    EXPECT_EQ("const char LIBCELLML_VERSION[] = \"[LIBCELLML_VERSION]\";\n", generatorProfile->implementationLibcellmlVersionString());

    EXPECT_EQ("extern const size_t STATE_COUNT;\n", generatorProfile->interfaceStateCountString());
    EXPECT_EQ("const size_t STATE_COUNT = [STATE_COUNT];\n", generatorProfile->implementationStateCountString());

    EXPECT_EQ("extern const size_t VARIABLE_COUNT;\n", generatorProfile->interfaceVariableCountString());
    EXPECT_EQ("const size_t VARIABLE_COUNT = [VARIABLE_COUNT];\n", generatorProfile->implementationVariableCountString());

    EXPECT_EQ("typedef enum {\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(false, false));
    EXPECT_EQ("typedef enum {\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC,\n"
              "    EXTERNAL\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(false, true));
    EXPECT_EQ("typedef enum {\n"
              "    VARIABLE_OF_INTEGRATION,\n"
              "    STATE,\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(true, false));
    EXPECT_EQ("typedef enum {\n"
              "    VARIABLE_OF_INTEGRATION,\n"
              "    STATE,\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC,\n"
              "    EXTERNAL\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(true, true));

    EXPECT_EQ("VARIABLE_OF_INTEGRATION", generatorProfile->variableOfIntegrationVariableTypeString());
    EXPECT_EQ("STATE", generatorProfile->stateVariableTypeString());
    EXPECT_EQ("CONSTANT", generatorProfile->constantVariableTypeString());
    EXPECT_EQ("COMPUTED_CONSTANT", generatorProfile->computedConstantVariableTypeString());
    EXPECT_EQ("ALGEBRAIC", generatorProfile->algebraicVariableTypeString());
    EXPECT_EQ("EXTERNAL", generatorProfile->externalVariableTypeString());

    EXPECT_EQ("typedef struct {\n"
              "    char name[[NAME_SIZE]];\n"
              "    char units[[UNITS_SIZE]];\n"
              "    char component[[COMPONENT_SIZE]];\n"
              "    VariableType type;\n"
              "} VariableInfo;\n",
              generatorProfile->variableInfoObjectString());

    EXPECT_EQ("extern const VariableInfo VOI_INFO;\n", generatorProfile->interfaceVoiInfoString());
    EXPECT_EQ("const VariableInfo VOI_INFO = [CODE];\n", generatorProfile->implementationVoiInfoString());

    EXPECT_EQ("extern const VariableInfo STATE_INFO[];\n", generatorProfile->interfaceStateInfoString());
    EXPECT_EQ("const VariableInfo STATE_INFO[] = {\n"
              "[CODE]"
              "};\n",
              generatorProfile->implementationStateInfoString());

    EXPECT_EQ("extern const VariableInfo VARIABLE_INFO[];\n", generatorProfile->interfaceVariableInfoString());
    EXPECT_EQ("const VariableInfo VARIABLE_INFO[] = {\n"
              "[CODE]"
              "};\n",
              generatorProfile->implementationVariableInfoString());

    EXPECT_EQ("{\"[NAME]\", \"[UNITS]\", \"[COMPONENT]\", [TYPE]}", generatorProfile->variableInfoEntryString());

    EXPECT_EQ("voi", generatorProfile->voiString());

    EXPECT_EQ("states", generatorProfile->statesArrayString());
    EXPECT_EQ("rates", generatorProfile->ratesArrayString());
    EXPECT_EQ("variables", generatorProfile->variablesArrayString());

    EXPECT_EQ("typedef double (* ExternalVariable)(double *variables, size_t index);\n", generatorProfile->externalVariableMethodTypeDefinitionString(false));
    EXPECT_EQ("typedef double (* ExternalVariable)(double voi, double *states, double *rates, double *variables, size_t index);\n", generatorProfile->externalVariableMethodTypeDefinitionString(true));

    EXPECT_EQ("externalVariable(variables, [INDEX])", generatorProfile->externalVariableMethodCallString(false));
    EXPECT_EQ("externalVariable(voi, states, rates, variables, [INDEX])", generatorProfile->externalVariableMethodCallString(true));

    EXPECT_EQ("double * createStatesArray();\n",
              generatorProfile->interfaceCreateStatesArrayMethodString());
    EXPECT_EQ("double * createStatesArray()\n"
              "{\n"
              "    double *res = (double *) malloc(STATE_COUNT*sizeof(double));\n"
              "\n"
              "    for (size_t i = 0; i < STATE_COUNT; ++i) {\n"
              "        res[i] = NAN;\n"
              "    }\n"
              "\n"
              "    return res;\n"
              "}\n",
              generatorProfile->implementationCreateStatesArrayMethodString());

    EXPECT_EQ("typedef struct {\n"
              "    double *variables;\n"
              "} RootFindingInfo;\n",
              generatorProfile->rootFindingInfoObjectString(false));
    EXPECT_EQ("typedef struct {\n"
              "    double voi;\n"
              "    double *states;\n"
              "    double *rates;\n"
              "    double *variables;\n"
              "} RootFindingInfo;\n",
              generatorProfile->rootFindingInfoObjectString(true));
    EXPECT_EQ("extern void nlaSolve(void (*objectiveFunction)(double *, double *, void *),\n"
              "                     double *u, size_t n, void *data);\n",
              generatorProfile->externNlaSolveMethodString());
    EXPECT_EQ("findRoot[INDEX](variables);\n",
              generatorProfile->findRootCallString(false));
    EXPECT_EQ("findRoot[INDEX](voi, states, rates, variables);\n",
              generatorProfile->findRootCallString(true));
    EXPECT_EQ("void findRoot[INDEX](double *variables)\n"
              "{\n"
              "    RootFindingInfo rfi = { variables };\n"
              "    double u[[SIZE]];\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->findRootMethodString(false));
    EXPECT_EQ("void findRoot[INDEX](double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "    RootFindingInfo rfi = { voi, states, rates, variables };\n"
              "    double u[[SIZE]];\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->findRootMethodString(true));
    EXPECT_EQ("nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",
              generatorProfile->nlaSolveCallString(false));
    EXPECT_EQ("nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",
              generatorProfile->nlaSolveCallString(true));
    EXPECT_EQ("void objectiveFunction[INDEX](double *u, double *f, void *data)\n"
              "{\n"
              "    double *variables = ((RootFindingInfo *) data)->variables;\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->objectiveFunctionMethodString(false));
    EXPECT_EQ("void objectiveFunction[INDEX](double *u, double *f, void *data)\n"
              "{\n"
              "    double voi = ((RootFindingInfo *) data)->voi;\n"
              "    double *states = ((RootFindingInfo *) data)->states;\n"
              "    double *rates = ((RootFindingInfo *) data)->rates;\n"
              "    double *variables = ((RootFindingInfo *) data)->variables;\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->objectiveFunctionMethodString(true));
    EXPECT_EQ("u",
              generatorProfile->uArrayString());
    EXPECT_EQ("f",
              generatorProfile->fArrayString());

    EXPECT_EQ("double * createVariablesArray();\n",
              generatorProfile->interfaceCreateVariablesArrayMethodString());
    EXPECT_EQ("double * createVariablesArray()\n"
              "{\n"
              "    double *res = (double *) malloc(VARIABLE_COUNT*sizeof(double));\n"
              "\n"
              "    for (size_t i = 0; i < VARIABLE_COUNT; ++i) {\n"
              "        res[i] = NAN;\n"
              "    }\n"
              "\n"
              "    return res;\n"
              "}\n",
              generatorProfile->implementationCreateVariablesArrayMethodString());

    EXPECT_EQ("void deleteArray(double *array);\n",
              generatorProfile->interfaceDeleteArrayMethodString());
    EXPECT_EQ("void deleteArray(double *array)\n"
              "{\n"
              "    free(array);\n"
              "}\n",
              generatorProfile->implementationDeleteArrayMethodString());

    EXPECT_EQ("void initialiseVariables(double *variables);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(false, false));
    EXPECT_EQ("void initialiseVariables(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(false, false));

    EXPECT_EQ("void initialiseVariables(double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(false, true));
    EXPECT_EQ("void initialiseVariables(double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(false, true));

    EXPECT_EQ("void initialiseVariables(double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(true, false));
    EXPECT_EQ("void initialiseVariables(double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(true, false));

    EXPECT_EQ("void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(true, true));
    EXPECT_EQ("void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(true, true));

    EXPECT_EQ("void computeComputedConstants(double *variables);\n",
              generatorProfile->interfaceComputeComputedConstantsMethodString());
    EXPECT_EQ("void computeComputedConstants(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeComputedConstantsMethodString());

    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceComputeRatesMethodString(false));
    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeRatesMethodString(false));

    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeRatesMethodString(true));
    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeRatesMethodString(true));

    EXPECT_EQ("void computeVariables(double *variables);\n",
              generatorProfile->interfaceComputeVariablesMethodString(false, false));
    EXPECT_EQ("void computeVariables(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(false, false));

    EXPECT_EQ("void computeVariables(double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeVariablesMethodString(false, true));
    EXPECT_EQ("void computeVariables(double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(false, true));

    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceComputeVariablesMethodString(true, false));
    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(true, false));

    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeVariablesMethodString(true, true));
    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(true, true));

    EXPECT_EQ("", generatorProfile->emptyMethodString());

    EXPECT_EQ("    ", generatorProfile->indentString());

    EXPECT_EQ("{", generatorProfile->openArrayInitialiserString());
    EXPECT_EQ("}", generatorProfile->closeArrayInitialiserString());

    EXPECT_EQ("[", generatorProfile->openArrayString());
    EXPECT_EQ("]", generatorProfile->closeArrayString());

    EXPECT_EQ(",", generatorProfile->arrayElementSeparatorString());

    EXPECT_EQ("\"", generatorProfile->stringDelimiterString());

    EXPECT_EQ(";", generatorProfile->commandSeparatorString());
}